

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netbase.cpp
# Opt level: O3

IntrRecvError InterruptibleRecv(uint8_t *data,size_t len,milliseconds timeout,Sock *sock)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  int extraout_var;
  int *piVar6;
  IntrRecvError IVar7;
  long lVar8;
  long in_FS_OFFSET;
  long lVar5;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  lVar4 = std::chrono::_V2::steady_clock::now();
  if (0 < timeout.__r && len != 0) {
    lVar4 = lVar4 / 1000000;
    lVar8 = timeout.__r + lVar4;
    IVar7 = NetworkError;
    do {
      iVar3 = (*sock->_vptr_Sock[4])(sock,data,len,0);
      lVar5 = CONCAT44(extraout_var,iVar3);
      if (lVar5 == 0 || extraout_var < 0) {
        if (lVar5 == 0) {
          IVar7 = Disconnected;
          goto LAB_00d53afe;
        }
        piVar6 = __errno_location();
        iVar3 = *piVar6;
        if (((iVar3 != 0xb) && (iVar3 != 0x73)) && (iVar3 != 0x16)) goto LAB_00d53afe;
        lVar4 = lVar8 - lVar4;
        if (999 < lVar4) {
          lVar4 = 1000;
        }
        iVar3 = (*sock->_vptr_Sock[0xe])(sock,lVar4,1,0);
        if ((char)iVar3 == '\0') goto LAB_00d53afe;
      }
      else {
        len = len - lVar5;
        data = data + lVar5;
      }
      bVar2 = CThreadInterrupt::operator_cast_to_bool(&g_socks5_interrupt);
      if (bVar2) {
        IVar7 = Interrupted;
        goto LAB_00d53afe;
      }
      lVar4 = std::chrono::_V2::steady_clock::now();
    } while ((len != 0) && (lVar4 = lVar4 / 1000000, lVar4 < lVar8));
  }
  IVar7 = (IntrRecvError)(len != 0);
LAB_00d53afe:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return IVar7;
  }
  __stack_chk_fail();
}

Assistant:

static IntrRecvError InterruptibleRecv(uint8_t* data, size_t len, std::chrono::milliseconds timeout, const Sock& sock)
{
    auto curTime{Now<SteadyMilliseconds>()};
    const auto endTime{curTime + timeout};
    while (len > 0 && curTime < endTime) {
        ssize_t ret = sock.Recv(data, len, 0); // Optimistically try the recv first
        if (ret > 0) {
            len -= ret;
            data += ret;
        } else if (ret == 0) { // Unexpected disconnection
            return IntrRecvError::Disconnected;
        } else { // Other error or blocking
            int nErr = WSAGetLastError();
            if (nErr == WSAEINPROGRESS || nErr == WSAEWOULDBLOCK || nErr == WSAEINVAL) {
                // Only wait at most MAX_WAIT_FOR_IO at a time, unless
                // we're approaching the end of the specified total timeout
                const auto remaining = std::chrono::milliseconds{endTime - curTime};
                const auto timeout = std::min(remaining, std::chrono::milliseconds{MAX_WAIT_FOR_IO});
                if (!sock.Wait(timeout, Sock::RECV)) {
                    return IntrRecvError::NetworkError;
                }
            } else {
                return IntrRecvError::NetworkError;
            }
        }
        if (g_socks5_interrupt) {
            return IntrRecvError::Interrupted;
        }
        curTime = Now<SteadyMilliseconds>();
    }
    return len == 0 ? IntrRecvError::OK : IntrRecvError::Timeout;
}